

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintAttrValue(TidyDocImpl *doc,uint indent,ctmbstr value,uint delim,Bool wrappable,
                    Bool scriptAttr)

{
  TidyPrintImpl *pprint;
  uint *puVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Bool BVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  uint local_60;
  uint c;
  TidyIndent *local_58;
  uint local_4c;
  ctmbstr entity;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  pprint = &doc->pprint;
  entity = (ctmbstr)(ulong)*(uint *)((doc->config).value + 0x5f);
  local_4c = (wrappable == no) + 4;
  if (((value != (ctmbstr)0x0) && (*value == '<')) &&
     ((value[1] == '%' ||
      ((value[1] == '@' || (iVar3 = prvTidytmbstrncmp(value,"<?php",5), iVar3 == 0)))))) {
    local_4c = local_4c | 0x10;
  }
  uVar4 = 0x22;
  if (delim != 0) {
    uVar4 = delim;
  }
  AddChar(pprint,0x3d);
  if ((*(int *)((doc->config).value + 100) == 0) || (*(int *)((doc->config).value + 0x62) != 0)) {
    SetWrap(doc,indent);
    CheckWrapIndent(doc,indent);
  }
  AddChar(pprint,uVar4);
  if (value != (ctmbstr)0x0) {
    local_34 = *(uint *)((doc->config).value + 0x5d);
    uVar6 = (doc->pprint).ixInd;
    local_38 = (doc->pprint).linelen;
    (doc->pprint).indent[uVar6].attrValStart = local_38;
    (doc->pprint).indent[uVar6].attrStringStart = -1;
    local_58 = (doc->pprint).indent;
    bVar11 = entity != (ctmbstr)0x0;
    bVar12 = uVar4 == 0x22;
    pcVar9 = "&#39;";
    if (bVar12) {
      pcVar9 = "&quot;";
    }
    bVar13 = uVar4 == 0x27;
    local_60 = 0xffffffff;
    entity = pcVar9;
    local_3c = uVar4;
    while( true ) {
      cVar2 = *value;
      uVar8 = (uint)cVar2;
      if (cVar2 == '\0') break;
      c = uVar8;
      if ((wrappable == no) || (cVar2 != ' ')) {
        if (wrappable != no) goto LAB_001479c0;
      }
      else {
        uVar8 = (doc->pprint).linelen;
        if ((ulong)(uVar8 + indent) < (doc->config).value[0x5d].v) {
          if (local_58->spaces < 0) {
            local_58->spaces = indent;
          }
          (doc->pprint).wraphere = uVar8;
          uVar6 = (doc->pprint).ixInd;
        }
        else {
          uVar6 = (doc->pprint).ixInd;
          if (uVar6 == 0) {
            (doc->pprint).indent[1].spaces = indent;
            (doc->pprint).ixInd = 1;
            uVar8 = (doc->pprint).wraphere;
            iVar3 = (doc->pprint).indent[0].attrStringStart;
            iVar5 = iVar3 - uVar8;
            if (iVar5 != 0 && (int)uVar8 <= iVar3) {
              (doc->pprint).indent[1].attrStringStart = iVar5;
              (doc->pprint).indent[0].attrStringStart = -1;
            }
            iVar3 = (doc->pprint).indent[0].attrValStart;
            uVar6 = 1;
            iVar5 = iVar3 - uVar8;
            if (iVar5 != 0 && (int)uVar8 <= iVar3) {
              (doc->pprint).indent[1].attrValStart = iVar5;
              (doc->pprint).indent[0].attrValStart = -1;
            }
          }
        }
        local_58[uVar6].attrValStart = local_38;
        local_58[uVar6].attrStringStart = local_60;
LAB_001479c0:
        if ((doc->pprint).wraphere != 0) {
          iVar3 = (doc->pprint).indent[0].spaces;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if (local_34 <= iVar3 + (doc->pprint).linelen) {
            BVar7 = WantIndent(doc);
            if (BVar7 != no) {
              WriteIndentChar(doc);
            }
            for (uVar10 = 0; uVar10 < (doc->pprint).wraphere; uVar10 = uVar10 + 1) {
              prvTidyWriteChar((doc->pprint).linebuf[uVar10],doc->docOut);
            }
            BVar7 = IsWrapInString(pprint);
            uVar4 = 0x5c;
            if (BVar7 == no) {
              uVar4 = 0x20;
            }
            prvTidyWriteChar(uVar4,doc->docOut);
            prvTidyWriteChar(10,doc->docOut);
            puVar1 = &(doc->pprint).line;
            *puVar1 = *puVar1 + 1;
            ResetLineAfterWrap(pprint);
            uVar4 = local_3c;
          }
        }
      }
      if (c == uVar4) {
        AddString(pprint,entity);
LAB_00147b95:
        value = value + 1;
      }
      else {
        if (c == 0x27) {
          bVar14 = bVar12;
          if (*(int *)((doc->config).value + 0x46) == 0) {
            AddChar(pprint,0x27);
          }
          else {
            AddString(pprint,"&#39;");
          }
joined_r0x00147b65:
          if (bVar14 && (bVar11 && scriptAttr != no)) {
            uVar6 = (doc->pprint).ixInd;
            local_60 = 0xffffffff;
            if (local_58[uVar6].attrStringStart < 0) {
              local_60 = (doc->pprint).linelen;
            }
            local_58[uVar6].attrStringStart = local_60;
          }
          goto LAB_00147b95;
        }
        if (c == 0x22) {
          bVar14 = bVar13;
          if (*(int *)((doc->config).value + 0x46) == 0) {
            AddChar(pprint,0x22);
          }
          else {
            AddString(pprint,"&quot;");
          }
          goto joined_r0x00147b65;
        }
        if (0x7f < c) {
          uVar8 = prvTidyGetUTF8(value,&c);
          value = value + uVar8;
        }
        value = value + 1;
        if (c == 10) {
          uVar8 = 0;
          if (((int)local_60 < 0) && (uVar8 = 0, *(int *)((doc->config).value + 0x2c) == 0)) {
            uVar8 = indent;
          }
          prvTidyPFlushLine(doc,uVar8);
        }
        else {
          PPrintChar(doc,c,local_4c);
        }
      }
    }
    uVar6 = (doc->pprint).ixInd;
    local_58[uVar6].attrValStart = -1;
    local_58[uVar6].attrStringStart = -1;
  }
  AddChar(pprint,uVar4);
  return;
}

Assistant:

static void PPrintAttrValue( TidyDocImpl* doc, uint indent,
                             ctmbstr value, uint delim, Bool wrappable, Bool scriptAttr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool scriptlets = cfgBool(doc, TidyWrapScriptlets);

    uint mode = PREFORMATTED | ATTRIBVALUE;
    if ( wrappable )
        mode = NORMAL | ATTRIBVALUE;

    /* look for ASP, Tango or PHP instructions for computed attribute value */
    if ( value && value[0] == '<' )
    {
        if ( value[1] == '%' || value[1] == '@'||
             TY_(tmbstrncmp)(value, "<?php", 5) == 0 )
            mode |= CDATA;
    }

    if ( delim == 0 )
        delim = '"';

    AddChar( pprint, '=' );

    /* don't wrap after "=" for xml documents */
    if ( !cfgBool(doc, TidyXmlOut) || cfgBool(doc, TidyXhtmlOut) )
    {
        SetWrap( doc, indent );
        CheckWrapIndent( doc, indent );
        /*
        if ( !SetWrap(doc, indent) )
            PCondFlushLine( doc, indent );
        */
    }

    AddChar( pprint, delim );

    if ( value )
    {
        uint wraplen = cfg( doc, TidyWrapLen );
        int attrStart = SetInAttrVal( pprint );
        int strStart = ClearInString( pprint );

        while (*value != '\0')
        {
            uint c = *value;

            if ( wrappable && c == ' ' )
                SetWrapAttr( doc, indent, attrStart, strStart );

            if ( wrappable && pprint->wraphere > 0 &&
                 GetSpaces(pprint) + pprint->linelen >= wraplen )
                WrapAttrVal( doc );

            if ( c == delim )
            {
                ctmbstr entity = (c == '"' ? "&quot;" : "&#39;");
                AddString( pprint, entity );
                ++value;
                continue;
            }
            else if (c == '"')
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&quot;" );
                else
                    AddChar( pprint, c );

                if ( delim == '\'' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }
            else if ( c == '\'' )
            {
                if ( cfgBool(doc, TidyQuoteMarks) )
                    AddString( pprint, "&#39;" );
                else
                    AddChar( pprint, c );

                if ( delim == '"' && scriptAttr && scriptlets )
                    strStart = ToggleInString( pprint );

                ++value;
                continue;
            }

            /* look for UTF-8 multibyte character */
            if ( c > 0x7F )
                 value += TY_(GetUTF8)( value, &c );
            ++value;

            if ( c == '\n' )
            {
                /* No indent inside Javascript literals */
                TY_(PFlushLine)( doc, (strStart < 0
                                       && !cfgBool(doc, TidyLiteralAttribs) ?
                                       indent : 0) );
                continue;
            }
            PPrintChar( doc, c, mode );
        }
        ClearInAttrVal( pprint );
        ClearInString( pprint );
    }
    AddChar( pprint, delim );
}